

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeyore_dump.cpp
# Opt level: O2

ostream * operator<<(ostream *out,ee_expr_op *op)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  long lStack_30;
  
  if (op->numop == 1) {
    iVar1 = op->op;
    poVar2 = std::operator<<(out,"  ");
    poVar2 = operator<<(poVar2,&op->sym);
    poVar2 = std::operator<<(poVar2," = ");
    if (iVar1 != 0x10e) {
      pcVar3 = opname2str(op->op);
      poVar2 = std::operator<<(poVar2,pcVar3);
      lStack_30 = 8;
      goto LAB_0011534d;
    }
  }
  else {
    poVar2 = std::operator<<(out,"  ");
    poVar2 = operator<<(poVar2,&op->sym);
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = operator<<(poVar2,&op->a);
    poVar2 = std::operator<<(poVar2," ");
    pcVar3 = opname2str(op->op);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," ");
  }
  lStack_30 = 0x14;
LAB_0011534d:
  poVar2 = operator<<(poVar2,(ee_rval *)(&(op->sym).type + lStack_30));
  std::endl<char,std::char_traits<char>>(poVar2);
  return out;
}

Assistant:

DEFOUT(const ee_expr_op &op) {
  if(op.numop == 1) {
    if(op.op == OP_ADD) out << "  " << op.sym << " = " << op.b << endl;
    else out << "  " << op.sym << " = " << opname2str(op.op) << op.a << endl;
  }
  else {
    out << "  " << op.sym << " = " << op.a << " " << opname2str(op.op) << " " << op.b << endl;
  }
  return out;
}